

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::
Cloner<robin_hood::detail::Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>,_false>
::operator()(Cloner<robin_hood::detail::Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>,_false>
             *this,Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
                   *s,
            Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
            *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Node *pNVar3;
  Node *pNVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  
  uVar10 = t->mMask + 1;
  if (uVar10 < 0x28f5c28f5c28f5d) {
    uVar12 = (uVar10 * 0x50) / 100;
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar10 >> 2;
    uVar12 = (SUB168(auVar5 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  uVar14 = 0xff;
  if (uVar12 < 0xff) {
    uVar14 = uVar12;
  }
  lVar13 = uVar14 + uVar10;
  if (lVar13 + 8U != 0) {
    memmove(t->mInfo,s->mInfo,lVar13 + 8U);
  }
  if (lVar13 != 0) {
    lVar9 = 0;
    lVar11 = 0;
    do {
      if (t->mInfo[lVar11] != '\0') {
        pNVar3 = t->mKeyVals;
        pNVar4 = s->mKeyVals;
        *(undefined8 *)((long)&(pNVar3->mData).second.texcoords[1].y + lVar9) =
             *(undefined8 *)((long)&(pNVar4->mData).second.texcoords[1].y + lVar9);
        puVar1 = (undefined8 *)((long)(pNVar4->mData).second.texcoords + lVar9 + -0x14);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)(pNVar4->mData).second.texcoords + lVar9 + -4);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)(pNVar3->mData).second.texcoords + lVar9 + -4);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)(pNVar3->mData).second.texcoords + lVar9 + -0x14);
        *puVar1 = uVar6;
        puVar1[1] = uVar7;
      }
      lVar11 = lVar11 + 1;
      lVar9 = lVar9 + 0x28;
    } while (lVar13 != lVar11);
  }
  return;
}

Assistant:

void operator()(M const& s, M& t) const {
            auto const numElementsWithBuffer = t.calcNumElementsWithBuffer(t.mMask + 1);
            std::copy(s.mInfo, s.mInfo + t.calcNumBytesInfo(numElementsWithBuffer), t.mInfo);

            for (size_t i = 0; i < numElementsWithBuffer; ++i) {
                if (t.mInfo[i]) {
                    ::new (static_cast<void*>(t.mKeyVals + i)) Node(t, *s.mKeyVals[i]);
                }
            }
        }